

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# failure_test.cxx
# Opt level: O3

int main(int argc,char **argv)

{
  _Bit_iterator *p_Var1;
  __int_type_conflict1 _Var2;
  debugging_options *pdVar3;
  initializer_list<bool> __l;
  TestSuite ts;
  allocator_type local_1a9;
  vector<bool,_std::allocator<bool>_> local_1a8;
  bool local_17a [2];
  TestRange<bool> local_178;
  test_func local_140;
  test_func local_120;
  test_func local_100;
  test_func local_e0;
  string local_c0;
  test_func local_a0;
  TestSuite local_80;
  
  TestSuite::TestSuite(&local_80,argc,argv);
  local_80.options.printTestMessage = true;
  pdVar3 = nuraft::debugging_options::get_instance();
  LOCK();
  _Var2 = (pdVar3->disable_reconn_backoff_)._M_base._M_i;
  (pdVar3->disable_reconn_backoff_)._M_base._M_i = true;
  UNLOCK();
  p_Var1 = &local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish;
  local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,"simple conflict test","",_Var2);
  local_a0.super__Function_base._M_functor._8_8_ = 0;
  local_a0.super__Function_base._M_functor._M_unused._M_object = failure_test::simple_conflict_test;
  local_a0._M_invoker = std::_Function_handler<int_(),_int_(*)()>::_M_invoke;
  local_a0.super__Function_base._M_manager = std::_Function_handler<int_(),_int_(*)()>::_M_manager;
  TestSuite::doTest(&local_80,(string *)&local_1a8,&local_a0);
  if (local_a0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a0.super__Function_base._M_manager)
              ((_Any_data *)&local_a0,(_Any_data *)&local_a0,__destroy_functor);
  }
  if ((_Bit_iterator *)
      local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != p_Var1) {
    operator_delete(local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,"remove not responding server with quorum test","");
  local_17a[0] = false;
  local_17a[1] = true;
  __l._M_len = 2;
  __l._M_array = local_17a;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_1a8,__l,&local_1a9);
  local_178.type = ARRAY;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_178.array,&local_1a8);
  local_178.begin = false;
  local_178.end = false;
  local_178.step = false;
  TestSuite::doTest<bool,int(*)(bool)>
            (&local_80,&local_c0,failure_test::rmv_not_resp_srv_wq_test,&local_178);
  if (local_178.array.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_178.array.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_178.array.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_178.array.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    local_178.array.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_178.array.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    local_178.array.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if ((_Bit_iterator *)
      local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_iterator *)0x0) {
    operator_delete(local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,"force log compaction test","");
  local_e0.super__Function_base._M_functor._8_8_ = 0;
  local_e0.super__Function_base._M_functor._M_unused._M_object =
       failure_test::force_log_compaction_test;
  local_e0._M_invoker = std::_Function_handler<int_(),_int_(*)()>::_M_invoke;
  local_e0.super__Function_base._M_manager = std::_Function_handler<int_(),_int_(*)()>::_M_manager;
  TestSuite::doTest(&local_80,(string *)&local_1a8,&local_e0);
  if (local_e0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e0.super__Function_base._M_manager)
              ((_Any_data *)&local_e0,(_Any_data *)&local_e0,__destroy_functor);
  }
  if ((_Bit_iterator *)
      local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != p_Var1) {
    operator_delete(local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,"uncommitted config for new leader test","");
  local_100.super__Function_base._M_functor._8_8_ = 0;
  local_100.super__Function_base._M_functor._M_unused._M_object =
       failure_test::uncommitted_conf_new_leader_test;
  local_100._M_invoker = std::_Function_handler<int_(),_int_(*)()>::_M_invoke;
  local_100.super__Function_base._M_manager = std::_Function_handler<int_(),_int_(*)()>::_M_manager;
  TestSuite::doTest(&local_80,(string *)&local_1a8,&local_100);
  if (local_100.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_100.super__Function_base._M_manager)
              ((_Any_data *)&local_100,(_Any_data *)&local_100,__destroy_functor);
  }
  if ((_Bit_iterator *)
      local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != p_Var1) {
    operator_delete(local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,"removed server late step down test","");
  local_120.super__Function_base._M_functor._8_8_ = 0;
  local_120.super__Function_base._M_functor._M_unused._M_object =
       failure_test::removed_server_late_step_down_test;
  local_120._M_invoker = std::_Function_handler<int_(),_int_(*)()>::_M_invoke;
  local_120.super__Function_base._M_manager = std::_Function_handler<int_(),_int_(*)()>::_M_manager;
  TestSuite::doTest(&local_80,(string *)&local_1a8,&local_120);
  if (local_120.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_120.super__Function_base._M_manager)
              ((_Any_data *)&local_120,(_Any_data *)&local_120,__destroy_functor);
  }
  if ((_Bit_iterator *)
      local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != p_Var1) {
    operator_delete(local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,"remove server on pending configs test","");
  local_140.super__Function_base._M_functor._8_8_ = 0;
  local_140.super__Function_base._M_functor._M_unused._M_object =
       failure_test::remove_server_on_pending_configs_test;
  local_140._M_invoker = std::_Function_handler<int_(),_int_(*)()>::_M_invoke;
  local_140.super__Function_base._M_manager = std::_Function_handler<int_(),_int_(*)()>::_M_manager;
  TestSuite::doTest(&local_80,(string *)&local_1a8,&local_140);
  if (local_140.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_140.super__Function_base._M_manager)
              ((_Any_data *)&local_140,(_Any_data *)&local_140,__destroy_functor);
  }
  if ((_Bit_iterator *)
      local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != p_Var1) {
    operator_delete(local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  TestSuite::~TestSuite(&local_80);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    TestSuite ts(argc, argv);

    ts.options.printTestMessage = true;

    // Disable reconnection timer for deterministic test.
    debugging_options::get_instance().disable_reconn_backoff_ = true;

    ts.doTest( "simple conflict test",
               simple_conflict_test );

    ts.doTest( "remove not responding server with quorum test",
               rmv_not_resp_srv_wq_test,
               TestRange<bool>({false, true}) );

    ts.doTest( "force log compaction test",
               force_log_compaction_test );

    ts.doTest( "uncommitted config for new leader test",
               uncommitted_conf_new_leader_test );

    ts.doTest( "removed server late step down test",
               removed_server_late_step_down_test );

    ts.doTest( "remove server on pending configs test",
               remove_server_on_pending_configs_test );

    return 0;
}